

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::makeDebugSource(Builder *this,Id fileName)

{
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  Id IVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  Instruction *this_01;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  Id IVar7;
  bool bVar8;
  _Rb_tree_color local_34;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  
  this_00 = &this->debugSourceId;
  local_34 = fileName;
  iVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,&local_34);
  if (iVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur !=
      (__node_type *)0x0) {
    pmVar4 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_34);
    return *pmVar4;
  }
  IVar7 = this->uniqueId + 1;
  this->uniqueId = IVar7;
  this_01 = (Instruction *)operator_new(0x60);
  IVar2 = makeVoidType(this);
  this_01->_vptr_Instruction = (_func_int **)&PTR__Instruction_00927e68;
  this_01->resultId = IVar7;
  this_01->typeId = IVar2;
  this_01->opCode = OpExtInst;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_01->block = (Block *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this_01->operands,3);
  if ((this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage ==
      (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
    std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&this_01->idOperand,3);
  }
  Instruction::addIdOperand(this_01,this->nonSemanticShaderDebugInfo);
  Instruction::addImmediateOperand(this_01,0x23);
  Instruction::addIdOperand(this_01,local_34);
  if (this->emitNonSemanticShaderDebugSource != true) goto LAB_003d14d8;
  if (local_34 == this->mainFileId) {
    p_Var6 = (_Base_ptr)&this->sourceText;
  }
  else {
    p_Var6 = (this->includeFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var6 == (_Base_ptr)0x0) goto LAB_003d14d8;
    p_Var1 = &(this->includeFiles)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      bVar8 = p_Var6[1]._M_color < local_34;
      if (!bVar8) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar8];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 == p_Var1) || (local_34 < p_Var5[1]._M_color)) goto LAB_003d14d8;
    p_Var6 = p_Var5[1]._M_parent;
  }
  IVar2 = getStringId(this,(string *)p_Var6);
  if (IVar2 != 0) {
    Instruction::addIdOperand(this_01,IVar2);
  }
LAB_003d14d8:
  local_30._M_head_impl = this_01;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
  if (local_30._M_head_impl != (Instruction *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&this->module,this_01);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_34);
  *pmVar4 = IVar7;
  return IVar7;
}

Assistant:

Id Builder::makeDebugSource(const Id fileName) {
    if (debugSourceId.find(fileName) != debugSourceId.end())
        return debugSourceId[fileName];
    spv::Id resultId = getUniqueId();
    Instruction* sourceInst = new Instruction(resultId, makeVoidType(), OpExtInst);
    sourceInst->reserveOperands(3);
    sourceInst->addIdOperand(nonSemanticShaderDebugInfo);
    sourceInst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugSource);
    sourceInst->addIdOperand(fileName);
    if (emitNonSemanticShaderDebugSource) {
        spv::Id sourceId = 0;
        if (fileName == mainFileId) {
            sourceId = getStringId(sourceText);
        } else {
            auto incItr = includeFiles.find(fileName);
            if (incItr != includeFiles.end()) {
                sourceId = getStringId(*incItr->second);
            }
        }

        // We omit the optional source text item if not available in glslang
        if (sourceId != 0) {
            sourceInst->addIdOperand(sourceId);
        }
    }
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(sourceInst));
    module.mapInstruction(sourceInst);
    debugSourceId[fileName] = resultId;
    return resultId;
}